

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::AssertionResultData::~AssertionResultData(AssertionResultData *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->reconstructedExpression)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->reconstructedExpression).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->message).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

AssertionResultData() = delete;